

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *this_00;
  void *pvVar4;
  ulong uStack_20;
  char c;
  size_t i;
  ostream *os_local;
  XmlEncode *this_local;
  
  for (uStack_20 = 0; uVar2 = std::__cxx11::string::size(), uStack_20 < uVar2;
      uStack_20 = uStack_20 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    cVar1 = *pcVar3;
    switch(cVar1) {
    case '\"':
      if (this->m_forWhat == ForAttributes) {
        std::operator<<(os,"&quot;");
      }
      else {
        std::operator<<(os,cVar1);
      }
      break;
    default:
      if (((cVar1 < '\t') || (('\r' < cVar1 && (cVar1 < ' ')))) || (cVar1 == '\x7f')) {
        this_00 = std::operator<<(os,"&#x");
        pvVar4 = (void *)std::ostream::operator<<(this_00,std::uppercase);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::hex);
        std::ostream::operator<<(pvVar4,(int)cVar1);
      }
      else {
        std::operator<<(os,cVar1);
      }
      break;
    case '&':
      std::operator<<(os,"&amp;");
      break;
    case '<':
      std::operator<<(os,"&lt;");
      break;
    case '>':
      if (((uStack_20 < 3) ||
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 != ']')) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 != ']')) {
        std::operator<<(os,cVar1);
      }
      else {
        std::operator<<(os,"&gt;");
      }
    }
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << static_cast<int>( c );
                        else
                            os << c;
                }
            }
        }